

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

bool basisu::etc_block::get_diff_subblock_colors
               (color_rgba *pDst,uint16_t packed_color5,uint16_t packed_delta3,uint32_t table_idx)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t uVar8;
  uint uVar9;
  uint8_t uVar10;
  long lVar11;
  color_rgba result;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_2c;
  
  if (table_idx < 8) {
    lVar11 = (ulong)table_idx * 0x10;
    bVar3 = unpack_color5((color_rgba *)&local_2c.field_1,packed_color5,packed_delta3,true,0xff);
    uVar5 = (uint)local_2c.m_comps[0];
    uVar4 = (uint)local_2c.m_comps[1];
    iVar1 = *(int *)(g_etc1_inten_tables + lVar11);
    iVar2 = *(int *)(g_etc1_inten_tables + lVar11 + 4);
    uVar9 = iVar1 + uVar5;
    uVar7 = iVar1 + uVar4;
    uVar6 = iVar1 + (uint)local_2c.m_comps[2];
    uVar10 = 0xff;
    if (uVar9 < 0xff) {
      uVar10 = (uint8_t)uVar9;
    }
    if ((int)uVar9 < 0) {
      uVar10 = '\0';
    }
    uVar8 = 0xff;
    if (uVar7 < 0xff) {
      uVar8 = (uint8_t)uVar7;
    }
    (pDst->field_0).m_comps[0] = uVar10;
    if ((int)uVar7 < 0) {
      uVar8 = '\0';
    }
    uVar9 = 0xff;
    if (uVar6 < 0xff) {
      uVar9 = uVar6;
    }
    (pDst->field_0).m_comps[1] = uVar8;
    uVar10 = (uint8_t)uVar9;
    if ((int)uVar6 < 0) {
      uVar10 = '\0';
    }
    (pDst->field_0).m_comps[2] = uVar10;
    uVar9 = iVar2 + uVar5;
    uVar7 = iVar2 + uVar4;
    uVar6 = iVar2 + (uint)local_2c.m_comps[2];
    uVar10 = 0xff;
    if (uVar9 < 0xff) {
      uVar10 = (uint8_t)uVar9;
    }
    if ((int)uVar9 < 0) {
      uVar10 = '\0';
    }
    uVar8 = 0xff;
    if (uVar7 < 0xff) {
      uVar8 = (uint8_t)uVar7;
    }
    (pDst->field_0).m_comps[3] = 0xff;
    if ((int)uVar7 < 0) {
      uVar8 = '\0';
    }
    uVar9 = 0xff;
    if (uVar6 < 0xff) {
      uVar9 = uVar6;
    }
    pDst[1].field_0.m_comps[0] = uVar10;
    uVar10 = (uint8_t)uVar9;
    if ((int)uVar6 < 0) {
      uVar10 = '\0';
    }
    pDst[1].field_0.m_comps[1] = uVar8;
    pDst[1].field_0.m_comps[2] = uVar10;
    pDst[1].field_0.m_comps[3] = 0xff;
    iVar1 = *(int *)(g_etc1_inten_tables + lVar11 + 8);
    uVar9 = iVar1 + uVar5;
    uVar7 = iVar1 + uVar4;
    uVar6 = iVar1 + (uint)local_2c.m_comps[2];
    uVar10 = 0xff;
    if (uVar9 < 0xff) {
      uVar10 = (uint8_t)uVar9;
    }
    if ((int)uVar9 < 0) {
      uVar10 = '\0';
    }
    pDst[2].field_0.m_comps[0] = uVar10;
    uVar10 = 0xff;
    if (uVar7 < 0xff) {
      uVar10 = (uint8_t)uVar7;
    }
    if ((int)uVar7 < 0) {
      uVar10 = '\0';
    }
    pDst[2].field_0.m_comps[1] = uVar10;
    uVar9 = 0xff;
    if (uVar6 < 0xff) {
      uVar9 = uVar6;
    }
    uVar10 = (uint8_t)uVar9;
    if ((int)uVar6 < 0) {
      uVar10 = '\0';
    }
    pDst[2].field_0.m_comps[2] = uVar10;
    pDst[2].field_0.m_comps[3] = 0xff;
    iVar1 = *(int *)(g_etc1_inten_tables + lVar11 + 0xc);
    uVar5 = uVar5 + iVar1;
    uVar4 = uVar4 + iVar1;
    uVar7 = iVar1 + (uint)local_2c.m_comps[2];
    uVar9 = 0xff;
    if (uVar5 < 0xff) {
      uVar9 = uVar5;
    }
    uVar10 = (uint8_t)uVar9;
    if ((int)uVar5 < 0) {
      uVar10 = '\0';
    }
    uVar9 = 0xff;
    if (uVar4 < 0xff) {
      uVar9 = uVar4;
    }
    uVar8 = (uint8_t)uVar9;
    if ((int)uVar4 < 0) {
      uVar8 = '\0';
    }
    uVar9 = 0xff;
    if (uVar7 < 0xff) {
      uVar9 = uVar7;
    }
    pDst[3].field_0.m_comps[0] = uVar10;
    uVar10 = (uint8_t)uVar9;
    if ((int)uVar7 < 0) {
      uVar10 = '\0';
    }
    pDst[3].field_0.m_comps[1] = uVar8;
    pDst[3].field_0.m_comps[2] = uVar10;
    pDst[3].field_0.m_comps[3] = 0xff;
    return bVar3;
  }
  __assert_fail("table_idx < cETC1IntenModifierValues",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x22e,
                "static bool basisu::etc_block::get_diff_subblock_colors(color_rgba *, uint16_t, uint16_t, uint32_t)"
               );
}

Assistant:

bool etc_block::get_diff_subblock_colors(color_rgba* pDst, uint16_t packed_color5, uint16_t packed_delta3, uint32_t table_idx)
	{
		assert(table_idx < cETC1IntenModifierValues);
		const int *pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

		uint32_t r, g, b;
		bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

		const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

		const int y0 = pInten_modifer_table[0];
		pDst[0].set(ir + y0, ig + y0, ib + y0, 255);

		const int y1 = pInten_modifer_table[1];
		pDst[1].set(ir + y1, ig + y1, ib + y1, 255);

		const int y2 = pInten_modifer_table[2];
		pDst[2].set(ir + y2, ig + y2, ib + y2, 255);

		const int y3 = pInten_modifer_table[3];
		pDst[3].set(ir + y3, ig + y3, ib + y3, 255);

		return success;
	}